

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  uint *workSpace_00;
  uint *count;
  uint uVar1;
  int iVar2;
  HUF_repeat HVar3;
  uint *puVar4;
  size_t sVar5;
  size_t sVar6;
  HUF_CElt *table;
  size_t _var_err__;
  BYTE *pBVar7;
  bool bVar8;
  bool bVar9;
  HUF_CElt *CTable;
  int in_stack_ffffffffffffff90;
  uint maxSymbolValue_local;
  BYTE *local_60;
  uint *local_58;
  BYTE *local_50;
  uint *local_48;
  BYTE *local_40;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  
  maxSymbolValue_local = maxSymbolValue;
  local_60 = (BYTE *)dst;
  local_50 = (BYTE *)src;
  puVar4 = (uint *)HUF_alignUpWorkspace(workSpace,&wkspSize,8);
  pBVar7 = local_50;
  if (wkspSize < 0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
    maxSymbolValue = 0xff;
  }
  local_40 = local_60 + dstSize;
  uVar1 = 0xb;
  if (huffLog != 0) {
    uVar1 = huffLog;
  }
  bVar8 = (flags & 4U) != 0;
  bVar9 = repeat != (HUF_repeat *)0x0;
  if ((bVar9 && bVar8) && (*repeat == HUF_repeat_valid)) {
    sVar5 = HUF_compressCTable_internal
                      (local_60,local_60,local_40,local_50,srcSize,nbStreams,oldHufTable,
                       in_stack_ffffffffffffff90);
    return sVar5;
  }
  local_58 = (uint *)CONCAT44(local_58._4_4_,uVar1);
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    maxSymbolValueBegin = maxSymbolValue;
    uVar1 = HIST_count_simple(puVar4,&maxSymbolValueBegin,local_50,0x1000);
    local_48 = (uint *)(ulong)uVar1;
    maxSymbolValueEnd = maxSymbolValue;
    uVar1 = HIST_count_simple(puVar4,&maxSymbolValueEnd,pBVar7 + (srcSize - 0x1000),0x1000);
    if ((ulong)uVar1 + (long)local_48 < 0x45) {
      return 0;
    }
  }
  workSpace_00 = puVar4 + 0x302;
  local_48 = puVar4;
  sVar5 = HIST_count_wksp(puVar4,&maxSymbolValue_local,local_50,srcSize,workSpace_00,0x1000);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (sVar5 == srcSize) {
    *local_60 = *local_50;
    return 1;
  }
  if (sVar5 <= (srcSize >> 7) + 4) {
    return 0;
  }
  uVar1 = (uint)local_58;
  if (repeat != (HUF_repeat *)0x0) {
    HVar3 = *repeat;
    if (HVar3 == HUF_repeat_check) {
      iVar2 = HUF_validateCTable(oldHufTable,local_48,maxSymbolValue_local);
      uVar1 = (uint)local_58;
      if (iVar2 != 0) {
        pBVar7 = local_60;
        CTable = oldHufTable;
        if (bVar9 && bVar8) goto LAB_005dc223;
        goto LAB_005dc107;
      }
      *repeat = HUF_repeat_none;
      HVar3 = HUF_repeat_none;
    }
    pBVar7 = local_60;
    CTable = oldHufTable;
    if ((bVar9 && bVar8) && HVar3 != HUF_repeat_none) goto LAB_005dc223;
  }
LAB_005dc107:
  count = local_48;
  table = (HUF_CElt *)(puVar4 + 0x100);
  in_stack_ffffffffffffff90 = flags;
  uVar1 = HUF_optimalTableLog(uVar1,srcSize,maxSymbolValue_local,workSpace_00,0x1300,table,local_48,
                              flags);
  sVar5 = HUF_buildCTable_wksp(table,count,maxSymbolValue_local,uVar1,workSpace_00,0x1300);
  uVar1 = maxSymbolValue_local;
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  local_58 = workSpace_00;
  memset(table + (maxSymbolValue_local + 2),0,(ulong)(maxSymbolValue_local + 2) * -8 + 0x808);
  sVar5 = HUF_writeCTable_wksp(local_60,dstSize,table,uVar1,(uint)sVar5,local_58,0x2ec);
  puVar4 = local_48;
  uVar1 = maxSymbolValue_local;
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar5 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat != HUF_repeat_none) {
      local_58 = (uint *)HUF_estimateCompressedSize(oldHufTable,local_48,maxSymbolValue_local);
      sVar6 = HUF_estimateCompressedSize(table,puVar4,uVar1);
      pBVar7 = local_60;
      CTable = oldHufTable;
      if ((srcSize <= sVar5 + 0xc) || (local_58 <= (uint *)(sVar6 + sVar5))) goto LAB_005dc223;
    }
    if (srcSize <= sVar5 + 0xc) {
      return 0;
    }
    *repeat = HUF_repeat_none;
  }
  pBVar7 = local_60 + sVar5;
  CTable = table;
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,table,0x808);
  }
LAB_005dc223:
  sVar5 = HUF_compressCTable_internal
                    (local_60,pBVar7,local_40,local_50,srcSize,nbStreams,CTable,
                     in_stack_ffffffffffffff90);
  return sVar5;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}